

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::loadSkeleton(Application *this,char *filename,Scene *scene)

{
  bool bVar1;
  reference ppSVar2;
  SceneObject *o;
  ostream *poVar3;
  reference ppJVar4;
  _Base_ptr in_RDX;
  _Base_ptr in_RSI;
  Skeleton *in_RDI;
  double knotTime;
  iterator __end3_1;
  iterator __begin3_1;
  set<double,_std::less<double>,_std::allocator<double>_> *__range3_1;
  Joint *joint;
  iterator __end3;
  iterator __begin3;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range3;
  set<double,_std::less<double>,_std::allocator<double>_> knotTimes;
  stringstream loadfilename;
  Mesh *mesh;
  SceneObject *object;
  iterator __end1;
  iterator __begin1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range1;
  int meshID;
  string filenameNoExt;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_stack_fffffffffffffce8;
  _Base_ptr in_stack_fffffffffffffcf0;
  Scene *this_00;
  Timeline *this_01;
  _Self local_2b0;
  _Self local_2a8;
  undefined1 *local_2a0;
  Joint *local_298;
  Joint **local_290;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_288;
  _Base_ptr local_280;
  string local_278 [32];
  undefined1 local_258 [48];
  stringstream local_228 [16];
  ostream local_218 [376];
  SceneObject *local_a0;
  Scene *local_98;
  _Self local_90;
  _Self local_88;
  _Base_ptr *local_80;
  int local_74;
  string local_70 [55];
  allocator local_39;
  _Base_ptr local_18;
  _Base_ptr filename_00;
  
  local_18 = in_RDX;
  filename_00 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,(char *)in_RSI,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this_01 = (Timeline *)&stack0xffffffffffffffc8;
  std::__cxx11::string::find((char *)this_01,0x30e3a1);
  std::__cxx11::string::substr((ulong)local_70,(ulong)this_01);
  std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc8,local_70);
  std::__cxx11::string::~string(local_70);
  local_74 = 0;
  local_80 = &local_18[4]._M_right;
  local_88._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_fffffffffffffce8);
  local_90._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(in_stack_fffffffffffffce8);
  while( true ) {
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                         in_stack_fffffffffffffcf0);
    this_00 = (Scene *)*ppSVar2;
    local_98 = this_00;
    if (this_00 == (Scene *)0x0) {
      o = (SceneObject *)0x0;
    }
    else {
      o = (SceneObject *)
          __dynamic_cast(this_00,&DynamicScene::SceneObject::typeinfo,&DynamicScene::Mesh::typeinfo,
                         0);
    }
    local_a0 = o;
    if (o != (SceneObject *)0x0) {
      std::__cxx11::stringstream::stringstream(local_228);
      poVar3 = std::operator<<(local_218,(string *)&stack0xffffffffffffffc8);
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_74);
      std::operator<<(poVar3,"_skel.xml");
      in_stack_fffffffffffffcf0 =
           local_a0[1].positions.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      DynamicScene::Skeleton::load(in_RDI,(char *)filename_00);
      std::__cxx11::string::~string(local_278);
      local_280 = local_a0[1].positions.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                  + 8;
      local_288._M_current =
           (Joint **)
           std::
           vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
           begin((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                  *)in_stack_fffffffffffffce8);
      local_290 = (Joint **)
                  std::
                  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                  ::end((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         *)in_stack_fffffffffffffce8);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                            *)in_stack_fffffffffffffcf0,
                           (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                            *)in_stack_fffffffffffffce8);
        if (!bVar1) break;
        ppJVar4 = __gnu_cxx::
                  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                  ::operator*(&local_288);
        local_298 = *ppJVar4;
        DynamicScene::Scene::addObject(this_00,o);
        __gnu_cxx::
        __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
        ::operator++(&local_288);
      }
      local_2a0 = local_258;
      local_2a8._M_node =
           (_Base_ptr)
           std::set<double,_std::less<double>,_std::allocator<double>_>::begin
                     ((set<double,_std::less<double>,_std::allocator<double>_> *)
                      in_stack_fffffffffffffce8);
      local_2b0._M_node =
           (_Base_ptr)
           std::set<double,_std::less<double>,_std::allocator<double>_>::end
                     ((set<double,_std::less<double>,_std::allocator<double>_> *)
                      in_stack_fffffffffffffce8);
      while( true ) {
        bVar1 = std::operator!=(&local_2a8,&local_2b0);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<double>::operator*
                  ((_Rb_tree_const_iterator<double> *)in_stack_fffffffffffffcf0);
        Timeline::markTime(this_01,(int)((ulong)this_00 >> 0x20));
        std::_Rb_tree_const_iterator<double>::operator++
                  ((_Rb_tree_const_iterator<double> *)in_stack_fffffffffffffcf0);
      }
      local_74 = local_74 + 1;
      std::set<double,_std::less<double>,_std::allocator<double>_>::~set
                ((set<double,_std::less<double>,_std::allocator<double>_> *)0x26d1e9);
      std::__cxx11::stringstream::~stringstream(local_228);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
               in_stack_fffffffffffffcf0);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void CMU462::Application::loadSkeleton(const char *filename,
                                       DynamicScene::Scene *scene) {
  string filenameNoExt(filename);
  filenameNoExt = filenameNoExt.substr(0, filenameNoExt.find("."));
  int meshID = 0;
  for (auto object : scene->objects) {
    DynamicScene::Mesh *mesh = dynamic_cast<DynamicScene::Mesh *>(object);
    if (mesh) {
      stringstream loadfilename;
      loadfilename << filenameNoExt << "_" << meshID << "_skel.xml";
      set<double> knotTimes = mesh->skeleton->load(loadfilename.str().c_str());
      // Add all joints to the scene
      for (auto joint : mesh->skeleton->joints) {
        scene->addObject(joint);
      }
      // Mark all knots on the timeline
      for (auto knotTime : knotTimes) {
        timeline.markTime(knotTime);
      }
      meshID++;
    }
  }
}